

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.cpp
# Opt level: O2

ResultCode __thiscall kpeg::JPEGDecoder::decodeImageFile(JPEGDecoder *this)

{
  ifstream *piVar1;
  char cVar2;
  Level LVar3;
  ResultCode RVar4;
  Logger *pLVar5;
  ostream *poVar6;
  istream *piVar7;
  Level lvl;
  Level lvl_00;
  Level lvl_01;
  Level lvl_02;
  Level lvl_03;
  string local_80;
  UInt8 byte;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  cVar2 = std::__basic_file<char>::is_open();
  if ((cVar2 == '\0') ||
     (piVar1 = &this->m_imageFile,
     *(int *)(&this->field_0x40 + *(long *)(*(long *)piVar1 + -0x18)) != 0)) {
    pLVar5 = Logger::get();
    LVar3 = Logger::getLevel(pLVar5);
    RVar4 = ERROR;
    if ((int)LVar3 < 0) {
      return ERROR;
    }
    pLVar5 = Logger::get();
    poVar6 = Logger::getStream(pLVar5);
    Logger::levelStr_abi_cxx11_(&local_80,(Logger *)0x0,lvl);
    poVar6 = std::operator<<(poVar6,(string *)&local_80);
    poVar6 = std::operator<<(poVar6,"[ kpeg:");
    poVar6 = std::operator<<(poVar6,"Decoder.cpp");
    poVar6 = std::operator<<(poVar6,":");
    *(uint *)(&poVar6->field_0x18 + (long)poVar6->_vptr_basic_ostream[-3]) =
         *(uint *)(&poVar6->field_0x18 + (long)poVar6->_vptr_basic_ostream[-3]) & 0xffffffb5 | 2;
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x5e);
    poVar6 = std::operator<<(poVar6," ] ");
    std::operator+(&local_40,"Unable scan image file: \'",&this->m_filename);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&byte,
                   &local_40,"\'");
    poVar6 = std::operator<<(poVar6,(string *)&byte);
    std::endl<char,std::char_traits<char>>(poVar6);
    std::__cxx11::string::~string((string *)&byte);
    std::__cxx11::string::~string((string *)&local_40);
  }
  else {
    pLVar5 = Logger::get();
    LVar3 = Logger::getLevel(pLVar5);
    if (0 < (int)LVar3) {
      pLVar5 = Logger::get();
      poVar6 = Logger::getStream(pLVar5);
      Logger::levelStr_abi_cxx11_(&local_80,(Logger *)0x1,lvl_00);
      poVar6 = std::operator<<(poVar6,(string *)&local_80);
      poVar6 = std::operator<<(poVar6,"[ kpeg:");
      poVar6 = std::operator<<(poVar6,"Decoder.cpp");
      poVar6 = std::operator<<(poVar6,":");
      *(uint *)(&poVar6->field_0x18 + (long)poVar6->_vptr_basic_ostream[-3]) =
           *(uint *)(&poVar6->field_0x18 + (long)poVar6->_vptr_basic_ostream[-3]) & 0xffffffb5 | 2;
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x62);
      poVar6 = std::operator<<(poVar6," ] ");
      poVar6 = std::operator<<(poVar6,"Started decoding process...");
      std::endl<char,std::char_traits<char>>(poVar6);
      std::__cxx11::string::~string((string *)&local_80);
    }
    do {
      *(uint *)(&this->field_0x38 + *(long *)(*(long *)&this->m_imageFile + -0x18)) =
           *(uint *)(&this->field_0x38 + *(long *)(*(long *)&this->m_imageFile + -0x18)) &
           0xffffefff;
      piVar7 = std::operator>>((istream *)piVar1,(char *)&byte);
      if (((byte)piVar7[*(long *)(*(long *)piVar7 + -0x18) + 0x20] & 5) != 0) {
        decodeScanData(this);
        Image::createImageFromMCUs(&this->m_image,&this->m_MCU);
        pLVar5 = Logger::get();
        LVar3 = Logger::getLevel(pLVar5);
        RVar4 = DECODE_DONE;
        if ((int)LVar3 < 1) {
          return DECODE_DONE;
        }
        pLVar5 = Logger::get();
        poVar6 = Logger::getStream(pLVar5);
        Logger::levelStr_abi_cxx11_(&local_80,(Logger *)0x1,lvl_02);
        poVar6 = std::operator<<(poVar6,(string *)&local_80);
        poVar6 = std::operator<<(poVar6,"[ kpeg:");
        poVar6 = std::operator<<(poVar6,"Decoder.cpp");
        poVar6 = std::operator<<(poVar6,":");
        *(uint *)(&poVar6->field_0x18 + (long)poVar6->_vptr_basic_ostream[-3]) =
             *(uint *)(&poVar6->field_0x18 + (long)poVar6->_vptr_basic_ostream[-3]) & 0xffffffb5 | 2
        ;
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x8b);
        poVar6 = std::operator<<(poVar6," ] ");
        poVar6 = std::operator<<(poVar6,"Finished decoding process [OK].");
        std::endl<char,std::char_traits<char>>(poVar6);
        goto LAB_0012218f;
      }
      if (byte != 0xff) {
        pLVar5 = Logger::get();
        LVar3 = Logger::getLevel(pLVar5);
        RVar4 = ERROR;
        if ((int)LVar3 < 0) {
          return ERROR;
        }
        pLVar5 = Logger::get();
        poVar6 = Logger::getStream(pLVar5);
        Logger::levelStr_abi_cxx11_(&local_80,(Logger *)0x0,lvl_03);
        poVar6 = std::operator<<(poVar6,(string *)&local_80);
        poVar6 = std::operator<<(poVar6,"[ kpeg:");
        poVar6 = std::operator<<(poVar6,"Decoder.cpp");
        poVar6 = std::operator<<(poVar6,":");
        *(uint *)(&poVar6->field_0x18 + (long)poVar6->_vptr_basic_ostream[-3]) =
             *(uint *)(&poVar6->field_0x18 + (long)poVar6->_vptr_basic_ostream[-3]) & 0xffffffb5 | 2
        ;
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x81);
        poVar6 = std::operator<<(poVar6," ] ");
        poVar6 = std::operator<<(poVar6,"[ FATAL ] Invalid JFIF file! Terminating...");
        std::endl<char,std::char_traits<char>>(poVar6);
        goto LAB_0012218f;
      }
      *(uint *)(&this->field_0x38 + *(long *)(*(long *)&this->m_imageFile + -0x18)) =
           *(uint *)(&this->field_0x38 + *(long *)(*(long *)&this->m_imageFile + -0x18)) &
           0xffffefff;
      std::operator>>((istream *)piVar1,(char *)&byte);
      RVar4 = parseSegmentInfo(this,byte);
    } while (RVar4 != TERMINATE);
    pLVar5 = Logger::get();
    LVar3 = Logger::getLevel(pLVar5);
    if ((int)LVar3 < 1) {
      return TERMINATE;
    }
    pLVar5 = Logger::get();
    poVar6 = Logger::getStream(pLVar5);
    RVar4 = TERMINATE;
    Logger::levelStr_abi_cxx11_(&local_80,(Logger *)0x1,lvl_01);
    poVar6 = std::operator<<(poVar6,(string *)&local_80);
    poVar6 = std::operator<<(poVar6,"[ kpeg:");
    poVar6 = std::operator<<(poVar6,"Decoder.cpp");
    poVar6 = std::operator<<(poVar6,":");
    *(uint *)(&poVar6->field_0x18 + (long)poVar6->_vptr_basic_ostream[-3]) =
         *(uint *)(&poVar6->field_0x18 + (long)poVar6->_vptr_basic_ostream[-3]) & 0xffffffb5 | 2;
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x8f);
    poVar6 = std::operator<<(poVar6," ] ");
    poVar6 = std::operator<<(poVar6,"Terminated decoding process [NOT-OK].");
    std::endl<char,std::char_traits<char>>(poVar6);
  }
LAB_0012218f:
  std::__cxx11::string::~string((string *)&local_80);
  return RVar4;
}

Assistant:

JPEGDecoder::ResultCode JPEGDecoder::decodeImageFile()
    {
        if ( !m_imageFile.is_open() || !m_imageFile.good() )
        {
            LOG(Logger::Level::ERROR) << "Unable scan image file: \'" + m_filename + "\'" << std::endl;
            return ResultCode::ERROR;
        }
        
        LOG(Logger::Level::INFO) << "Started decoding process..." << std::endl;
        
        UInt8 byte;
        ResultCode status = ResultCode::DECODE_DONE;
        
        // TODO: Fix this spaghetti code for keeping track of decode status
        
        while ( m_imageFile >> std::noskipws >> byte )
        {
            if ( byte == JFIF_BYTE_FF )
            {
                m_imageFile >> std::noskipws >> byte;
                
                ResultCode code = parseSegmentInfo(byte);
                
                if ( code == ResultCode::SUCCESS )
                    continue;
                else if ( code == ResultCode::TERMINATE )
                {
                    status = ResultCode::TERMINATE;
                    break;
                }
                else if ( code == ResultCode::DECODE_INCOMPLETE )
                {
                    status = ResultCode::DECODE_INCOMPLETE;
                    break;
                }
            }
            else
            {
                //std::cout <<m_imageFile.tellg() << "ZZZZZZ: " << std::hex << byte << std::endl;
                LOG(Logger::Level::ERROR) << "[ FATAL ] Invalid JFIF file! Terminating..." << std::endl;
                status = ResultCode::ERROR;
                break;
            }
        }
        
        if ( status == ResultCode::DECODE_DONE )
        {
            decodeScanData();
            m_image.createImageFromMCUs( m_MCU );
            LOG(Logger::Level::INFO) << "Finished decoding process [OK]." << std::endl;
        }
        else if ( status == ResultCode::TERMINATE )
        {
            LOG(Logger::Level::INFO) << "Terminated decoding process [NOT-OK]." << std::endl;
        }
        
        else if ( status == ResultCode::DECODE_INCOMPLETE )
        {
            LOG(Logger::Level::INFO) << "Decoding process incomplete [NOT-OK]." << std::endl;
        }
        
        return status;
    }